

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O0

void __thiscall
glcts::FramebufferNoAttachmentsApiCase::end_fbo(FramebufferNoAttachmentsApiCase *this,GLenum target)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLenum target_local;
  FramebufferNoAttachmentsApiCase *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_FramebufferNoAttachmentsBaseCase).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x78))(target,0);
  (**(code **)(lVar3 + 0x440))(1,&this->m_fbo);
  (**(code **)(lVar3 + 0x460))(1,&this->m_renderbuffer);
  (**(code **)(lVar3 + 0x480))(1,&this->m_texture);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"error deleting framebuffer / renderbuffer / texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cFramebufferNoAttachmentsTests.cpp"
                  ,0xb9);
  this->m_fbo = 0;
  this->m_renderbuffer = 0;
  this->m_texture = 0;
  return;
}

Assistant:

void FramebufferNoAttachmentsApiCase::end_fbo(GLenum target)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(target, 0);
	gl.deleteFramebuffers(1, &m_fbo);
	gl.deleteRenderbuffers(1, &m_renderbuffer);
	gl.deleteTextures(1, &m_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "error deleting framebuffer / renderbuffer / texture");
	m_fbo		   = 0;
	m_renderbuffer = 0;
	m_texture	  = 0;
}